

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
* __thiscall node::anon_unknown_2::NodeImpl::getNetLocalAddresses(NodeImpl *this)

{
  long lVar1;
  bool bVar2;
  CConnman *in_RDI;
  long in_FS_OFFSET;
  map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  *in_stack_ffffffffffffffc8;
  CConnman *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)
                     in_stack_ffffffffffffffc8);
  if (bVar2) {
    std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::operator->
              ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)in_stack_ffffffffffffffc8);
    CConnman::getNetLocalAddresses(this_00);
  }
  else {
    memset(in_RDI,0,0x30);
    std::
    map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
    ::map(in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
            *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::map<CNetAddr, LocalServiceInfo> getNetLocalAddresses() override
    {
        if (m_context->connman)
            return m_context->connman->getNetLocalAddresses();
        else
            return {};
    }